

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::FocusableItemRegister(ImGuiWindow *window,ImGuiID id,bool tab_stop)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  
  pIVar1 = GImGui;
  uVar3 = (window->DC).ItemFlags & 5;
  window->FocusIdxAllCounter = window->FocusIdxAllCounter + 1;
  if (uVar3 == 1) {
    window->FocusIdxTabCounter = window->FocusIdxTabCounter + 1;
  }
  if ((((tab_stop) && (pIVar1->ActiveId == id)) && (window->FocusIdxAllRequestNext == 0x7fffffff))
     && (((window->FocusIdxTabRequestNext == 0x7fffffff && ((pIVar1->IO).KeyCtrl == false)) &&
         (iVar4 = (pIVar1->IO).KeyMap[0], -1 < iVar4)))) {
    bVar2 = IsKeyPressed(iVar4,true);
    if (bVar2) {
      iVar4 = 1;
      if ((pIVar1->IO).KeyShift != false) {
        iVar4 = -(uint)(uVar3 == 1);
      }
      window->FocusIdxTabRequestNext = iVar4 + window->FocusIdxTabCounter;
    }
  }
  bVar2 = window->FocusIdxAllCounter == window->FocusIdxAllRequestCurrent;
  if (uVar3 == 1 && !bVar2) {
    if (window->FocusIdxTabCounter == window->FocusIdxTabRequestCurrent) {
      pIVar1->NavJustTabbedId = id;
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool ImGui::FocusableItemRegister(ImGuiWindow* window, ImGuiID id, bool tab_stop)
{
    ImGuiContext& g = *GImGui;

    const bool allow_keyboard_focus = (window->DC.ItemFlags & (ImGuiItemFlags_AllowKeyboardFocus | ImGuiItemFlags_Disabled)) == ImGuiItemFlags_AllowKeyboardFocus;
    window->FocusIdxAllCounter++;
    if (allow_keyboard_focus)
        window->FocusIdxTabCounter++;

    // Process keyboard input at this point: TAB/Shift-TAB to tab out of the currently focused item.
    // Note that we can always TAB out of a widget that doesn't allow tabbing in.
    if (tab_stop && (g.ActiveId == id) && window->FocusIdxAllRequestNext == INT_MAX && window->FocusIdxTabRequestNext == INT_MAX && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab))
        window->FocusIdxTabRequestNext = window->FocusIdxTabCounter + (g.IO.KeyShift ? (allow_keyboard_focus ? -1 : 0) : +1); // Modulo on index will be applied at the end of frame once we've got the total counter of items.

    if (window->FocusIdxAllCounter == window->FocusIdxAllRequestCurrent)
        return true;
    if (allow_keyboard_focus && window->FocusIdxTabCounter == window->FocusIdxTabRequestCurrent)
    {
        g.NavJustTabbedId = id;
        return true;
    }

    return false;
}